

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

void helicsFederateLocalError(HelicsFederate fed,int errorCode,char *errorString,HelicsError *err)

{
  Federate *this;
  size_t sVar1;
  string_view message;
  long *local_48;
  size_t local_40;
  long local_38 [2];
  
  this = getFed(fed,err);
  if (this != (Federate *)0x0) {
    local_48 = local_38;
    if (errorString == (char *)0x0) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
                 gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p +
                 gHelicsEmptyStr_abi_cxx11_._M_string_length);
    }
    else {
      sVar1 = strlen(errorString);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,errorString,errorString + sVar1);
    }
    message._M_str = (char *)local_48;
    message._M_len = local_40;
    helics::Federate::localError(this,errorCode,message);
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
  }
  return;
}

Assistant:

void helicsFederateLocalError(HelicsFederate fed, int errorCode, const char* errorString, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->localError(errorCode, AS_STRING(errorString));
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}